

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t axbVecCreateBegin(axbHandle_s *handle,axbVec_s **vec)

{
  axbVec_s *paVar1;
  char *pcVar2;
  
  paVar1 = (axbVec_s *)malloc(0x48);
  *vec = paVar1;
  paVar1->handle = handle;
  paVar1->init = 0x1d232;
  pcVar2 = (char *)malloc(10);
  paVar1->name = pcVar2;
  *pcVar2 = '\0';
  paVar1->name_capacity = 10;
  paVar1->data = (void *)0x0;
  paVar1->datatype = AXB_REAL_DOUBLE;
  paVar1->memBackend = *handle->memBackends;
  paVar1->opBackend = *handle->opBackends;
  return 0;
}

Assistant:

axbStatus_t axbVecCreateBegin(struct axbHandle_s *handle, struct axbVec_s **vec)
{
  *vec = malloc(sizeof(struct axbVec_s));
  (*vec)->handle = handle;
  (*vec)->init = 119346;

  // set defaults:
  (*vec)->name = malloc(10);
  (*vec)->name[0] = 0;
  (*vec)->name_capacity = 10;

  (*vec)->data = NULL;
  (*vec)->datatype = AXB_REAL_DOUBLE;

  (*vec)->memBackend = handle->memBackends[0];
  (*vec)->opBackend  = handle->opBackends[0];

  return 0;
}